

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

void flatbuffers::tests::EnumStringsTest(void)

{
  bool bVar1;
  Parser parser3;
  Parser parser2;
  Parser parser1;
  IDLOptions IStack_1998;
  Parser local_1688;
  Parser local_f08;
  Parser local_788;
  
  IDLOptions::IDLOptions((IDLOptions *)&local_f08);
  Parser::Parser(&local_788,(IDLOptions *)&local_f08);
  IDLOptions::~IDLOptions((IDLOptions *)&local_f08);
  bVar1 = Parser::Parse(&local_788,
                        "enum E:byte { A, B, C } table T { F:[E]; }root_type T;{ F:[ A, B, \"C\", \"A B C\" ] }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser1.Parse(\"enum E:byte { A, B, C } table T { F:[E]; }\" \"root_type T;\" \"{ F:[ A, B, \\\"C\\\", \\\"A B C\\\" ] }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x22a,"");
  IDLOptions::IDLOptions((IDLOptions *)&local_1688);
  Parser::Parser(&local_f08,(IDLOptions *)&local_1688);
  IDLOptions::~IDLOptions((IDLOptions *)&local_1688);
  bVar1 = Parser::Parse(&local_f08,
                        "enum E:byte { A, B, C } table T { F:[int]; }root_type T;{ F:[ \"E.C\", \"E.A E.B E.C\" ] }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser2.Parse(\"enum E:byte { A, B, C } table T { F:[int]; }\" \"root_type T;\" \"{ F:[ \\\"E.C\\\", \\\"E.A E.B E.C\\\" ] }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x22f,"");
  IDLOptions::IDLOptions(&IStack_1998);
  Parser::Parser(&local_1688,&IStack_1998);
  IDLOptions::~IDLOptions(&IStack_1998);
  bVar1 = Parser::Parse(&local_1688,
                        "enum E:uint16 (bit_flags) { F0, F07=7, F08, F14=14, F15 } table T { F: E = \"F15 F08\"; }root_type T;"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser3.Parse(\"enum E:uint16 (bit_flags) { F0, F07=7, F08, F14=14, F15 }\" \" table T { F: E = \\\"F15 F08\\\"; }\" \"root_type T;\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x236,"");
  Parser::~Parser(&local_1688);
  Parser::~Parser(&local_f08);
  Parser::~Parser(&local_788);
  return;
}

Assistant:

void EnumStringsTest() {
  flatbuffers::Parser parser1;
  TEST_EQ(parser1.Parse("enum E:byte { A, B, C } table T { F:[E]; }"
                        "root_type T;"
                        "{ F:[ A, B, \"C\", \"A B C\" ] }"),
          true);
  flatbuffers::Parser parser2;
  TEST_EQ(parser2.Parse("enum E:byte { A, B, C } table T { F:[int]; }"
                        "root_type T;"
                        "{ F:[ \"E.C\", \"E.A E.B E.C\" ] }"),
          true);
  // unsigned bit_flags
  flatbuffers::Parser parser3;
  TEST_EQ(
      parser3.Parse("enum E:uint16 (bit_flags) { F0, F07=7, F08, F14=14, F15 }"
                    " table T { F: E = \"F15 F08\"; }"
                    "root_type T;"),
      true);
}